

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O0

int deqp::gles31::Functional::getPrecisionNumIntegerBits(Precision precision)

{
  undefined4 local_c;
  Precision precision_local;
  
  if (precision == PRECISION_LOWP) {
    local_c = 9;
  }
  else if (precision == PRECISION_MEDIUMP) {
    local_c = 0x10;
  }
  else if (precision == PRECISION_HIGHP) {
    local_c = 0x20;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

static int getPrecisionNumIntegerBits (glu::Precision precision)
{
	switch (precision)
	{
		case glu::PRECISION_HIGHP:		return 32;
		case glu::PRECISION_MEDIUMP:	return 16;
		case glu::PRECISION_LOWP:		return 9;
		default:
			DE_ASSERT(false);
			return 0;
	}
}